

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O0

void __thiscall QKmsScreenConfig::QKmsScreenConfig(QKmsScreenConfig *this)

{
  QSize *in_RDI;
  
  *in_RDI = (QSize)&PTR__QKmsScreenConfig_001473c8;
  QString::QString((QString *)0x11b6ee);
  *(undefined1 *)&in_RDI[4].wd.m_i = 0;
  QSize::QSize(in_RDI);
  *(undefined1 *)&in_RDI[5].ht.m_i = 1;
  *(undefined1 *)((long)&in_RDI[5].ht.m_i + 1) = 0;
  *(undefined1 *)((long)&in_RDI[5].ht.m_i + 2) = 0;
  in_RDI[6].wd.m_i = 0;
  QMap<QString,_QMap<QString,_QVariant>_>::QMap((QMap<QString,_QMap<QString,_QVariant>_> *)0x11b721)
  ;
  return;
}

Assistant:

QKmsScreenConfig::QKmsScreenConfig()
    : m_headless(false)
    , m_hwCursor(true)
    , m_separateScreens(false)
    , m_pbuffers(false)
    , m_virtualDesktopLayout(VirtualDesktopLayoutHorizontal)
{
}